

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

void psiweight(double *phi,double *theta,double *psi,int p,int q,int j)

{
  void *__ptr;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  *psi = 1.0;
  __ptr = malloc((long)q * 8 + 8);
  uVar1 = 0;
  uVar2 = 0;
  if (0 < q) {
    uVar2 = (ulong)(uint)q;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    *(double *)((long)__ptr + uVar1 * 8 + 8) = theta[uVar1];
  }
  uVar2 = 0;
  uVar1 = (ulong)(uint)p;
  if (p < 1) {
    uVar1 = uVar2;
  }
  for (lVar3 = 1; lVar3 < j; lVar3 = lVar3 + 1) {
    psi[lVar3] = 0.0;
    dVar6 = 0.0;
    dVar7 = 0.0;
    if (lVar3 <= q) {
      dVar7 = *(double *)((long)__ptr + lVar3 * 8);
      psi[lVar3] = dVar7;
    }
    uVar4 = uVar2;
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      if (-1 < (long)uVar4) {
        dVar6 = dVar6 + phi[uVar5] * psi[uVar4];
      }
      uVar4 = uVar4 - 1;
    }
    psi[lVar3] = dVar6 + dVar7;
    uVar2 = uVar2 + 1;
  }
  free(__ptr);
  return;
}

Assistant:

void psiweight(double *phi,double *theta,double *psi,int p,int q,int j) {
	int i,k;
	double temp;
	double *th;
	psi[0] = 1.0;
	th = (double*) malloc(sizeof(double) * (q+1));	
	th[0] = 1.;
	for(i = 0; i < q;++i) {
		th[i+1] = theta[i];
	}
	
	for(i = 1; i < j;++i) {
		psi[i] = 0.0;
		temp = 0.0;
		if(i <= q) {
			psi[i] = th[i];
		}
		for(k = 1; k < p+1;++k) {
			if((i - k) >= 0) {
				temp+=phi[k-1] * psi[i-k];
			} 
			
		}
		psi[i] += temp;
	}
	
	free(th);
}